

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Bool write_nrx4_reg(Emulator *e,Channel *channel,Address addr,u8 value,u16 max_length)

{
  byte bVar1;
  ushort uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 uVar6;
  undefined1 uVar7;
  
  uVar6 = (undefined7)((ulong)channel >> 8);
  uVar3 = CONCAT71(in_register_00000009,value);
  uVar4 = uVar3 & 0xffffffff;
  uVar7 = channel->length_enabled != FALSE;
  channel->length_enabled = (Bool)(uVar3 >> 6) & TRUE;
  *(byte *)((long)&channel->frequency + 1) = value & 7;
  bVar1 = (e->state).apu.frame;
  uVar5 = (ulong)addr;
  if ((((value & 0x40) != 0 && (bVar1 & 1) == 0) && !(bool)uVar7) && (channel->length != 0)) {
    uVar2 = channel->length - 1;
    channel->length = uVar2;
    HOOK_write_nrx4_extra_length_clock_abi(e,(char *)CONCAT71(uVar6,uVar7),uVar5,uVar4,(ulong)uVar2)
    ;
    if ((-1 < (char)uVar4) && (channel->length == 0)) {
      HOOK_write_nrx4_disable_channel_ab(e,(char *)CONCAT71(uVar6,uVar7),uVar5,uVar4);
      channel->status = FALSE;
    }
  }
  if ((char)uVar4 < '\0') {
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled != FALSE && (bVar1 & 1) == 0) {
        channel->length = max_length - 1;
      }
      HOOK_write_nrx4_trigger_new_length_abi
                (e,(char *)CONCAT71(uVar6,uVar7),uVar5,uVar3 & 0xffffffff,(ulong)channel->length);
    }
    if (channel->dac_enabled != FALSE) {
      channel->status = TRUE;
    }
  }
  uVar3 = uVar3 >> 7 & 0x1ffffff;
  HOOK_write_nrx4_info_abii
            (e,(char *)CONCAT71(uVar6,uVar7),uVar5,uVar4,uVar3,(ulong)channel->length_enabled);
  return (Bool)uVar3;
}

Assistant:

static Bool write_nrx4_reg(Emulator* e, Channel* channel, Address addr,
                           u8 value, u16 max_length) {
  Bool trigger = UNPACK(value, NRX4_INITIAL);
  Bool was_length_enabled = channel->length_enabled;
  channel->length_enabled = UNPACK(value, NRX4_LENGTH_ENABLED);
  channel->frequency &= 0xff;
  channel->frequency |= UNPACK(value, NRX4_FREQUENCY_HI) << 8;

  /* Extra length clocking occurs on NRX4 writes if the next APU frame isn't a
   * length counter frame. This only occurs on transition from disabled to
   * enabled. */
  Bool next_frame_is_length = (APU.frame & 1) == 1;
  if (UNLIKELY(!was_length_enabled && channel->length_enabled &&
               !next_frame_is_length && channel->length > 0)) {
    channel->length--;
    HOOK(write_nrx4_extra_length_clock_abi, addr, value, channel->length);
    if (!trigger && channel->length == 0) {
      HOOK(write_nrx4_disable_channel_ab, addr, value);
      channel->status = FALSE;
    }
  }

  if (trigger) {
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled && !next_frame_is_length) {
        channel->length--;
      }
      HOOK(write_nrx4_trigger_new_length_abi, addr, value, channel->length);
    }
    if (channel->dac_enabled) {
      channel->status = TRUE;
    }
  }

  HOOK(write_nrx4_info_abii, addr, value, trigger, channel->length_enabled);
  return trigger;
}